

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Cpu.cpp
# Opt level: O3

int __thiscall Snes_Spc::dsp_read(Snes_Spc *this,rel_time_t time)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar2 = (ulong)((this->m).smp_regs[0][2] & 0x7f);
  iVar1 = (this->m).dsp_time;
  uVar3 = time - (this->reg_times[uVar2] + iVar1);
  if (-1 < (int)uVar3) {
    uVar3 = uVar3 & 0x7fffffe0;
    (this->m).dsp_time = iVar1 + uVar3 + 0x20;
    Spc_Dsp::run(&this->dsp,uVar3 + 0x20);
    uVar2 = (ulong)((this->m).smp_regs[0][2] & 0x7f);
  }
  return (int)(this->dsp).m.regs[uVar2];
}

Assistant:

int Snes_Spc::dsp_read( rel_time_t time )
{
	RUN_DSP( time, reg_times [REGS [r_dspaddr] & 0x7F] );
	
	int result = dsp.read( REGS [r_dspaddr] & 0x7F );
	
	#ifdef SPC_DSP_READ_HOOK
		SPC_DSP_READ_HOOK( spc_time + time, (REGS [r_dspaddr] & 0x7F), result );
	#endif
	
	return result;
}